

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms_level.cc
# Opt level: O3

int __thiscall webrtc::RMSLevel::RMS(RMSLevel *this)

{
  float fVar1;
  float fVar2;
  
  if (this->sample_count_ != 0) {
    fVar1 = this->sum_square_;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar1 = log10f(fVar1 / ((float)this->sample_count_ * 1.0737418e+09));
      fVar1 = fVar1 * 10.0;
      if (fVar1 <= 0.0) {
        fVar2 = -127.0;
        if (-127.0 <= fVar1) {
          fVar2 = fVar1;
        }
        this->sum_square_ = 0.0;
        this->sample_count_ = 0;
        return (int)(0.5 - fVar2);
      }
      __assert_fail("rms <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/rms_level.cc"
                    ,0x34,"int webrtc::RMSLevel::RMS()");
    }
  }
  this->sum_square_ = 0.0;
  this->sample_count_ = 0;
  return 0x7f;
}

Assistant:

int RMSLevel::RMS() {
  if (sample_count_ == 0 || sum_square_ == 0) {
    Reset();
    return kMinLevel;
  }

  // Normalize by the max level.
  float rms = sum_square_ / (sample_count_ * kMaxSquaredLevel);
  // 20log_10(x^0.5) = 10log_10(x)
  rms = 10 * log10(rms);
  assert(rms <= 0);
  if (rms < -kMinLevel)
    rms = -kMinLevel;

  rms = -rms;
  Reset();
  return static_cast<int>(rms + 0.5);
}